

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.h
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>::AddElement
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid> *this,TPZCompElSide *celside,
          int64_t meshindex)

{
  TPZCompElSide *pTVar1;
  int local_24;
  
  if ((this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements <= meshindex) {
    (*(this->fElementVec).super_TPZVec<TPZCompElSide>._vptr_TPZVec[3])
              (&this->fElementVec,meshindex + 1);
    TPZManVector<int,_5>::Resize
              (&(this->super_TPZMultiphysicsElement).fActiveApproxSpace,meshindex + 1,&local_24);
  }
  pTVar1 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore;
  pTVar1[meshindex].fSide = celside->fSide;
  pTVar1[meshindex].fEl = celside->fEl;
  return;
}

Assistant:

virtual void AddElement(const TPZCompElSide &celside, int64_t meshindex) override
    {
        if (fElementVec.size() <= meshindex)
        {
            fElementVec.resize(meshindex+1);
            fActiveApproxSpace.Resize(meshindex+1, 1);
        }
        fElementVec[meshindex] = celside;
    }